

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 compute_dist_all(dist_t *out_dist,vector_t obs,int32 featlen,vector_t *mean,vector_t *var,
                      float32 *det,int32 n_density)

{
  float64 diff2;
  float64 diff1;
  float64 dval2;
  float64 dval1;
  vector_t v2;
  vector_t v1;
  vector_t m2;
  vector_t m1;
  int32 d;
  int32 i;
  float32 *det_local;
  vector_t *var_local;
  vector_t *mean_local;
  int32 featlen_local;
  vector_t obs_local;
  dist_t *out_dist_local;
  
  for (m1._0_4_ = 0; (int)m1 < n_density + -1; m1._0_4_ = (int)m1 + 2) {
    dval2 = (float64)(double)(float)det[(int)m1];
    diff1 = (float64)(double)(float)det[(int)m1 + 1];
    for (m1._4_4_ = 0; m1._4_4_ < featlen; m1._4_4_ = m1._4_4_ + 1) {
      dval2 = (float64)((double)((float)obs[m1._4_4_] - (float)mean[(int)m1][m1._4_4_]) *
                        (double)((float)obs[m1._4_4_] - (float)mean[(int)m1][m1._4_4_]) *
                        (double)(float)var[(int)m1][m1._4_4_] + (double)dval2);
      diff1 = (float64)((double)((float)obs[m1._4_4_] - (float)mean[(int)m1 + 1][m1._4_4_]) *
                        (double)((float)obs[m1._4_4_] - (float)mean[(int)m1 + 1][m1._4_4_]) *
                        (double)(float)var[(int)m1 + 1][m1._4_4_] + (double)diff1);
    }
    out_dist[(int)m1].dist = dval2;
    out_dist[(int)m1].id = (int)m1;
    out_dist[(int)m1 + 1].dist = diff1;
    out_dist[(int)m1 + 1].id = (int)m1 + 1;
  }
  if ((int)m1 < n_density) {
    dval2 = (float64)(double)(float)det[(int)m1];
    for (m1._4_4_ = 0; m1._4_4_ < featlen; m1._4_4_ = m1._4_4_ + 1) {
      dval2 = (float64)((double)((float)obs[m1._4_4_] - (float)mean[(int)m1][m1._4_4_]) *
                        (double)((float)obs[m1._4_4_] - (float)mean[(int)m1][m1._4_4_]) *
                        (double)(float)var[(int)m1][m1._4_4_] + (double)dval2);
    }
    out_dist[(int)m1].dist = dval2;
    out_dist[(int)m1].id = (int)m1;
  }
  return 0;
}

Assistant:

static int32
compute_dist_all(dist_t * out_dist, vector_t obs, int32 featlen,
                 vector_t * mean, vector_t * var, float32 * det,
                 int32 n_density)
{
    int32 i, d;
    vector_t m1, m2, v1, v2;
    float64 dval1, dval2, diff1, diff2;

    for (d = 0; d < n_density - 1; d += 2) {
        m1 = mean[d];
        v1 = var[d];
        dval1 = det[d];
        m2 = mean[d + 1];
        v2 = var[d + 1];
        dval2 = det[d + 1];

        for (i = 0; i < featlen; i++) {
            diff1 = obs[i] - m1[i];
            dval1 += diff1 * diff1 * v1[i];
            diff2 = obs[i] - m2[i];
            dval2 += diff2 * diff2 * v2[i];
        }

        out_dist[d].dist = dval1;
        out_dist[d].id = d;
        out_dist[d + 1].dist = dval2;
        out_dist[d + 1].id = d + 1;
    }

    if (d < n_density) {
        m1 = mean[d];
        v1 = var[d];
        dval1 = det[d];

        for (i = 0; i < featlen; i++) {
            diff1 = obs[i] - m1[i];
            dval1 += diff1 * diff1 * v1[i];
        }

        out_dist[d].dist = dval1;
        out_dist[d].id = d;
    }

    return 0;
}